

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_step(sqlite3_stmt *pStmt)

{
  char cVar1;
  undefined8 *puVar2;
  sqlite3 *psVar3;
  long *plVar4;
  Vdbe *pVVar5;
  Vdbe *pVVar6;
  Vdbe *pVVar7;
  Vdbe *p_00;
  sqlite3 *db;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  long *plVar11;
  char *pcVar12;
  undefined4 uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  char *z2;
  long *plVar17;
  char *pcVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  long lVar26;
  Vdbe *p;
  long lVar27;
  Mem *pMVar28;
  Mem *pMVar29;
  Mem *local_190;
  Vdbe *local_188;
  char *local_180;
  Mem *local_178;
  byte *local_170;
  sqlite3_stmt *local_168;
  int local_15c;
  long local_158;
  sqlite3 *local_150;
  sqlite3_stmt *local_148;
  long local_140 [34];
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    pcVar12 = "API called with NULL prepared statement";
  }
  else {
    local_150 = *(sqlite3 **)pStmt;
    if (local_150 != (sqlite3 *)0x0) {
      if (local_150->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(local_150->mutex);
      }
      uVar8 = *(ushort *)(pStmt + 0x9a) & 0xfbff;
      local_148 = pStmt + 0xb8;
      local_168 = pStmt + 0x58;
      iVar22 = 0;
      do {
        *(ushort *)(pStmt + 0x9a) = uVar8;
        if (*(int *)(pStmt + 0x50) != -0x420df25d) {
          sqlite3_reset(pStmt);
        }
        puVar2 = *(undefined8 **)pStmt;
        if (*(char *)(puVar2 + 10) != '\0') {
          uVar10 = 7;
          goto LAB_0014dbaa;
        }
        uVar8 = *(ushort *)(pStmt + 0x9a);
        if (*(int *)(pStmt + 0x90) < 1) {
          if ((uVar8 & 0x20) == 0) {
            if (*(int *)(pStmt + 0x90) < 0) {
              iVar9 = *(int *)((long)puVar2 + 0x9c);
              if (iVar9 == 0) {
                *(undefined4 *)(puVar2 + 0x29) = 0;
              }
              if ((puVar2[0x19] != 0) && (*(char *)((long)puVar2 + 0x99) == '\0')) {
                sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar2,(sqlite3_int64 *)local_148);
                iVar9 = *(int *)((long)puVar2 + 0x9c);
              }
              *(int *)((long)puVar2 + 0x9c) = iVar9 + 1;
              uVar8 = *(ushort *)(pStmt + 0x9a);
              if ((uVar8 >> 8 & 1) == 0) {
                *(int *)(puVar2 + 0x14) = *(int *)(puVar2 + 0x14) + 1;
                uVar8 = *(ushort *)(pStmt + 0x9a);
              }
              *(undefined4 *)(pStmt + 0x90) = 0;
            }
            goto LAB_0014d01e;
          }
          uVar10 = 1;
          uVar13 = 0x11;
          goto LAB_0014d35b;
        }
LAB_0014d01e:
        local_15c = iVar22;
        if ((uVar8 & 3) == 0) {
          *(int *)((long)puVar2 + 0xa4) = *(int *)((long)puVar2 + 0xa4) + 1;
          uVar14 = sqlite3VdbeExec((Vdbe *)pStmt);
          *(int *)((long)puVar2 + 0xa4) = *(int *)((long)puVar2 + 0xa4) + -1;
          uVar10 = 100;
          if (uVar14 != 100) goto LAB_0014d230;
          goto LAB_0014d339;
        }
        psVar3 = *(sqlite3 **)pStmt;
        lVar21 = *(long *)(pStmt + 0x10);
        local_178 = (Mem *)(lVar21 + 0x38);
        releaseMemArray(local_178,8);
        *(undefined8 *)(pStmt + 0x28) = 0;
        if (*(int *)(pStmt + 0x94) == 7) {
          psVar3->mallocFailed = '\x01';
LAB_0014d226:
          uVar14 = 1;
          goto LAB_0014d230;
        }
        iVar22 = *(int *)(pStmt + 0x34);
        uVar8 = *(ushort *)(pStmt + 0x9a) & 3;
        iVar9 = iVar22;
        if (uVar8 == 1) {
          lVar27 = *(long *)(pStmt + 0x10);
          local_190 = (Mem *)(lVar27 + 0x1f8);
          if ((*(byte *)(lVar27 + 0x21c) & 0x10) == 0) goto LAB_0014d16b;
          uVar10 = *(int *)(lVar27 + 0x218) >> 3;
          plVar11 = *(long **)(lVar27 + 0x200);
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              iVar9 = iVar9 + *(int *)(plVar11[uVar15] + 8);
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
        }
        else {
          local_190 = (Mem *)0x0;
LAB_0014d16b:
          plVar11 = (long *)0x0;
          uVar10 = 0;
        }
        iVar19 = *(int *)(pStmt + 0x90);
        lVar27 = (long)iVar19;
        if (iVar9 <= iVar19) {
          iVar9 = iVar19;
        }
        lVar26 = lVar27 * 0x18;
        lVar23 = lVar27 + -1;
        do {
          iVar19 = iVar19 + 1;
          if (lVar23 - iVar9 == -1) {
            *(int *)(pStmt + 0x90) = iVar9 + 1;
            *(undefined4 *)(pStmt + 0x94) = 0;
            uVar14 = 0x65;
            goto LAB_0014d230;
          }
          lVar24 = lVar27;
          if (uVar8 != 2) break;
          lVar24 = lVar23 + 1;
          pcVar12 = (char *)(*(long *)(pStmt + 8) + lVar26);
          lVar26 = lVar26 + 0x18;
          lVar23 = lVar24;
        } while (*pcVar12 != -0x6a);
        iVar9 = (int)lVar24;
        *(int *)(pStmt + 0x90) = iVar19;
        if ((psVar3->u1).isInterrupted != 0) {
          *(undefined4 *)(pStmt + 0x94) = 9;
          sqlite3SetString((char **)local_168,psVar3,"%s","interrupted");
          goto LAB_0014d226;
        }
        iVar19 = iVar9 - iVar22;
        if (iVar9 < iVar22) {
          local_170 = (byte *)((long)iVar9 * 0x18 + *(long *)(pStmt + 8));
          iVar19 = iVar9;
        }
        else {
          plVar17 = (long *)*plVar11;
          iVar22 = (int)plVar17[1];
          plVar4 = plVar11;
          if (iVar22 <= iVar19) {
            do {
              iVar19 = iVar19 - iVar22;
              plVar17 = (long *)plVar4[1];
              iVar22 = (int)plVar17[1];
              plVar4 = plVar4 + 1;
            } while (iVar22 <= iVar19);
          }
          local_170 = (byte *)((long)iVar19 * 0x18 + *plVar17);
        }
        pMVar28 = local_178;
        if (uVar8 == 1) {
          *(undefined2 *)(lVar21 + 0x5c) = 4;
          *(undefined1 *)(lVar21 + 0x5e) = 1;
          *(long *)(lVar21 + 0x50) = (long)iVar19;
          *(undefined2 *)(lVar21 + 0x94) = 0xa02;
          pcVar12 = *(char **)(sqlite3OpcodeName_azName + (ulong)*local_170 * 8);
          *(char **)(lVar21 + 0x78) = pcVar12;
          uVar14 = 0xffffffff;
          do {
            uVar14 = uVar14 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar1 != '\0');
          *(uint *)(lVar21 + 0x90) = uVar14 & 0x3fffffff;
          *(undefined2 *)(lVar21 + 0x96) = 0x103;
          pMVar28 = (Mem *)(lVar21 + 0xa8);
          if (local_170[1] == 0xee) {
            if ((int)uVar10 < 1) {
              uVar15 = 0;
LAB_0014d5a9:
              if ((uint)uVar15 != uVar10) goto LAB_0014d5e8;
            }
            else {
              uVar15 = 0;
              do {
                if (plVar11[uVar15] == *(long *)(local_170 + 0x10)) goto LAB_0014d5a9;
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
            iVar22 = uVar10 * 8 + 8;
            iVar9 = sqlite3VdbeMemGrow(local_190,iVar22,(uint)(uVar10 != 0));
            if (iVar9 == 0) {
              *(undefined8 *)(local_190->z + (long)(int)uVar10 * 8) =
                   *(undefined8 *)(local_170 + 0x10);
              *(byte *)&local_190->flags = (byte)local_190->flags | 0x10;
              local_190->n = iVar22;
            }
          }
        }
LAB_0014d5e8:
        local_178 = pMVar28;
        pMVar29 = local_178;
        local_178->flags = 4;
        local_178->u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(local_170 + 4);
        local_178->type = '\x01';
        local_178[1].flags = 4;
        local_178[1].u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(local_170 + 8);
        local_178[1].type = '\x01';
        local_178[2].flags = 4;
        local_178[2].u = (anon_union_8_5_44880d43_for_u)(long)*(int *)(local_170 + 0xc);
        local_178[2].type = '\x01';
        pMVar28 = local_178 + 3;
        iVar22 = sqlite3VdbeMemGrow(pMVar28,0x20,0);
        uVar14 = 1;
        if (iVar22 != 0) goto LAB_0014d230;
        pMVar29[3].flags = 0x602;
        pcVar12 = pMVar29[3].z;
        pcVar25 = pcVar12;
        switch(local_170[1]) {
        case 0xed:
          *pcVar12 = '\0';
          break;
        case 0xee:
          pcVar18 = "program";
          goto LAB_0014d898;
        case 0xef:
        case 0xfa:
          local_158 = *(long *)(local_170 + 0x10);
          uVar10 = 0;
          local_180 = pcVar12;
          sqlite3_snprintf(0x20,pcVar12,"keyinfo(%d",(ulong)*(ushort *)(local_158 + 10));
          if (local_180 != (char *)0x0) {
            uVar10 = 0xffffffff;
            pcVar12 = local_180;
            do {
              uVar10 = uVar10 + 1;
              cVar1 = *pcVar12;
              pcVar12 = pcVar12 + 1;
            } while (cVar1 != '\0');
            uVar10 = uVar10 & 0x3fffffff;
          }
          if (*(short *)(local_158 + 10) != 0) {
            uVar15 = 0;
            do {
              plVar11 = *(long **)(local_158 + 0x18 + uVar15 * 8);
              pcVar12 = "nil";
              if ((plVar11 == (long *)0x0) || (pcVar12 = (char *)*plVar11, pcVar12 != (char *)0x0))
              {
                lVar21 = 0;
                do {
                  pcVar25 = pcVar12 + lVar21;
                  lVar21 = lVar21 + 1;
                } while (*pcVar25 != '\0');
                uVar20 = (int)lVar21 - 1U & 0x3fffffff;
              }
              else {
                pcVar12 = (char *)0x0;
                uVar20 = 0;
              }
              if (0x1a < (int)(uVar20 + uVar10)) {
                builtin_strncpy(local_180 + uVar10,",...",4);
                break;
              }
              local_180[uVar10] = ',';
              lVar21 = (ulong)uVar10 + 1;
              if (*(char *)(*(long *)(local_158 + 0x10) + uVar15) == '\0') {
                uVar10 = (uint)lVar21;
              }
              else {
                uVar10 = uVar10 + 2;
                local_180[lVar21] = '-';
              }
              memcpy(local_180 + uVar10,pcVar12,(ulong)(uVar20 + 1));
              uVar10 = uVar10 + uVar20;
              uVar15 = uVar15 + 1;
            } while (uVar15 < *(ushort *)(local_158 + 10));
          }
          (local_180 + uVar10)[0] = ')';
          (local_180 + uVar10)[1] = '\0';
          pcVar25 = local_180;
          pMVar29 = local_178;
          break;
        default:
          pcVar25 = *(char **)(local_170 + 0x10);
          if (*(char **)(local_170 + 0x10) == (char *)0x0) {
            *pcVar12 = '\0';
            pcVar25 = pcVar12;
          }
          break;
        case 0xf1:
          pcVar18 = "intarray";
LAB_0014d898:
          sqlite3_snprintf(0x20,pcVar12,pcVar18);
          break;
        case 0xf2:
          sqlite3_snprintf(0x20,pcVar12,"%d",(ulong)*(uint *)(local_170 + 0x10));
          break;
        case 0xf3:
          uVar16 = **(undefined8 **)(local_170 + 0x10);
          pcVar18 = "%lld";
          goto LAB_0014d843;
        case 0xf4:
          sqlite3_snprintf(0x20,pcVar12,"%.16g",(int)**(undefined8 **)(local_170 + 0x10));
          break;
        case 0xf6:
          sqlite3_snprintf(0x20,pcVar12,"vtab:%p:%p");
          break;
        case 0xf8:
          lVar21 = *(long *)(local_170 + 0x10);
          uVar8 = *(ushort *)(lVar21 + 0x24);
          if ((uVar8 & 2) != 0) {
            pcVar25 = *(char **)(lVar21 + 8);
            break;
          }
          if ((uVar8 & 4) != 0) {
            local_180 = pcVar12;
            sqlite3_snprintf(0x20,pcVar12,"%lld",*(undefined8 *)(lVar21 + 0x18));
            pcVar25 = local_180;
            break;
          }
          if ((uVar8 & 8) != 0) {
            local_180 = pcVar12;
            sqlite3_snprintf(0x20,pcVar12,"%.16g",(int)*(undefined8 *)(lVar21 + 0x10));
            pcVar25 = local_180;
            break;
          }
          if ((uVar8 & 1) != 0) {
            local_180 = pcVar12;
            sqlite3_snprintf(0x20,pcVar12,"NULL");
            pcVar25 = local_180;
            break;
          }
          pcVar25 = "(blob)";
          pcVar18 = "(blob)";
          if (pcVar12 == "(blob)") goto LAB_0014d944;
          goto LAB_0014d92b;
        case 0xfb:
          sqlite3_snprintf(0x20,pcVar12,"%s(%d)",*(undefined8 *)(*(long *)(local_170 + 0x10) + 0x30)
                          );
          break;
        case 0xfc:
          uVar16 = **(undefined8 **)(local_170 + 0x10);
          pcVar18 = "collseq(%.20s)";
LAB_0014d843:
          sqlite3_snprintf(0x20,pcVar12,pcVar18,uVar16);
        }
        pcVar18 = pMVar29[3].z;
        if (pcVar25 == pcVar18) {
          if (pcVar25 == (char *)0x0) {
            uVar10 = 0;
          }
          else {
LAB_0014d944:
            uVar10 = ~(uint)pcVar25 + (int)pcVar18;
            do {
              uVar10 = uVar10 + 1;
              cVar1 = *pcVar18;
              pcVar18 = pcVar18 + 1;
            } while (cVar1 != '\0');
            uVar10 = uVar10 & 0x3fffffff;
          }
          pMVar29[3].n = uVar10;
          pMVar29[3].enc = '\x01';
        }
        else {
LAB_0014d92b:
          sqlite3VdbeMemSetStr(pMVar28,pcVar25,-1,'\x01',(_func_void_void_ptr *)0x0);
        }
        pMVar29[3].type = '\x03';
        uVar8 = *(ushort *)(pStmt + 0x9a);
        if ((uVar8 & 3) == 1) {
          iVar22 = sqlite3VdbeMemGrow(pMVar29 + 4,4,0);
          if (iVar22 == 0) {
            pMVar29[4].flags = 0x602;
            pMVar29[4].n = 2;
            sqlite3_snprintf(3,pMVar29[4].z,"%.2x",(ulong)local_170[3]);
            pMVar29[4].type = '\x03';
            pMVar29[4].enc = '\x01';
            pMVar29[5].flags = 1;
            pMVar29[5].type = '\x05';
            uVar8 = *(ushort *)(pStmt + 0x9a);
            goto LAB_0014d9fe;
          }
LAB_0014d230:
          if (((puVar2[0x19] != 0) && (*(char *)((long)puVar2 + 0x99) == '\0')) &&
             (*(long *)(pStmt + 0xd0) != 0)) {
            sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar2,local_140);
            (*(code *)puVar2[0x19])
                      (puVar2[0x1a],*(undefined8 *)(pStmt + 0xd0),
                       (local_140[0] - *(long *)(pStmt + 0xb8)) * 1000000);
          }
          uVar10 = uVar14;
          if (uVar14 == 0x65) {
            iVar22 = *(int *)(puVar2 + 5);
            if (iVar22 < 1) {
              *(undefined4 *)(pStmt + 0x94) = 0;
            }
            else {
              lVar21 = 0;
              lVar27 = 8;
              iVar9 = 0;
              do {
                lVar26 = puVar2[4];
                lVar23 = *(long *)(lVar26 + lVar27);
                if ((lVar23 != 0) &&
                   (lVar23 = *(long *)(**(long **)(lVar23 + 8) + 0x118), lVar23 != 0)) {
                  iVar19 = *(int *)(lVar23 + 0x18);
                  *(undefined4 *)(lVar23 + 0x18) = 0;
                  if (((code *)puVar2[0x21] != (code *)0x0) && ((0 < iVar19 && (iVar9 == 0)))) {
                    iVar9 = (*(code *)puVar2[0x21])
                                      (puVar2[0x22],puVar2,*(undefined8 *)(lVar26 + -8 + lVar27));
                    iVar22 = *(int *)(puVar2 + 5);
                  }
                }
                lVar21 = lVar21 + 1;
                lVar27 = lVar27 + 0x20;
              } while (lVar21 < iVar22);
              *(int *)(pStmt + 0x94) = iVar9;
              uVar10 = 1;
              if (iVar9 != 0) goto LAB_0014d339;
            }
            uVar10 = 0x65;
          }
        }
        else {
LAB_0014d9fe:
          *(ushort *)(pStmt + 0x48) = (~uVar8 & 3) << 2;
          *(long *)(pStmt + 0x28) = *(long *)(pStmt + 0x10) + 0x38;
          *(undefined4 *)(pStmt + 0x94) = 0;
          uVar10 = 100;
        }
LAB_0014d339:
        *(uint *)((long)puVar2 + 0x44) = uVar10;
        iVar9 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x94));
        uVar13 = 7;
        iVar22 = local_15c;
        if (iVar9 == 7) {
LAB_0014d35b:
          *(undefined4 *)(pStmt + 0x94) = uVar13;
        }
        if ((uVar10 - 0x66 < 0xfffffffe) && ((*(ushort *)(pStmt + 0x9a) & 0x200) != 0)) {
          uVar10 = sqlite3VdbeTransferError((Vdbe *)pStmt);
        }
        uVar10 = uVar10 & *(uint *)(puVar2 + 9);
        if (uVar10 != 0x11) goto LAB_0014dbb1;
        if (iVar22 == 0x32) {
          uVar10 = 0x11;
          goto LAB_0014dbb1;
        }
        if (((byte)pStmt[0x9b] & 2) == 0) {
          pcVar12 = (char *)0x0;
        }
        else {
          pcVar12 = *(char **)(pStmt + 0xd0);
        }
        psVar3 = *(sqlite3 **)pStmt;
        uVar10 = sqlite3LockAndPrepare
                           (psVar3,pcVar12,-1,0,(Vdbe *)pStmt,(sqlite3_stmt **)&local_188,
                            (char **)0x0);
        db = local_150;
        p_00 = local_188;
        if (uVar10 != 0) {
          if (uVar10 == 7) {
            psVar3->mallocFailed = '\x01';
          }
          if ((((byte)pStmt[0x9b] & 2) != 0) && (local_150->pErr != (sqlite3_value *)0x0)) {
            pcVar12 = (char *)sqlite3ValueText(local_150->pErr,'\x01');
            sqlite3DbFree(db,*(void **)local_168);
            if (db->mallocFailed == '\0') {
              pcVar12 = sqlite3DbStrDup(db,pcVar12);
            }
            else {
              uVar10 = 7;
              pcVar12 = (char *)0x0;
            }
            *(char **)local_168 = pcVar12;
LAB_0014dbaa:
            *(uint *)(pStmt + 0x94) = uVar10;
          }
LAB_0014dbb1:
          psVar3 = local_150;
          if ((uVar10 == 0xc0a) || (local_150->mallocFailed != '\0')) {
            uVar10 = 7;
            sqlite3Error(local_150,7,(char *)0x0);
            psVar3->mallocFailed = '\0';
          }
          uVar10 = uVar10 & psVar3->errMask;
          if (psVar3->mutex == (sqlite3_mutex *)0x0) {
            return uVar10;
          }
          (*sqlite3Config.mutex.xMutexLeave)(psVar3->mutex);
          return uVar10;
        }
        iVar22 = iVar22 + 1;
        memcpy(local_140,local_188,0x110);
        memcpy(p_00,pStmt,0x110);
        memcpy(pStmt,local_140,0x110);
        pVVar5 = *(Vdbe **)(pStmt + 0x68);
        pVVar6 = p_00->pPrev;
        pVVar7 = p_00->pNext;
        p_00->pPrev = *(Vdbe **)(pStmt + 0x60);
        p_00->pNext = pVVar5;
        *(Vdbe **)(pStmt + 0x60) = pVVar6;
        *(Vdbe **)(pStmt + 0x68) = pVVar7;
        pcVar12 = p_00->zSql;
        p_00->zSql = *(char **)(pStmt + 0xd0);
        *(char **)(pStmt + 0xd0) = pcVar12;
        *(ushort *)(pStmt + 0x9a) =
             *(ushort *)(pStmt + 0x9a) & 0xfdff | *(ushort *)&p_00->field_0x9a & 0x200;
        sqlite3TransferBindings((sqlite3_stmt *)p_00,pStmt);
        p_00->rc = 0;
        sqlite3VdbeFinalize(p_00);
        sqlite3_reset(pStmt);
        uVar8 = *(ushort *)(pStmt + 0x9a) | 0x400;
      } while( true );
    }
    pcVar12 = "API called with finalized prepared statement";
  }
  sqlite3_log(0x15,pcVar12);
  sqlite3_log(0x15,"misuse at line %d of [%.10s]",0xf8b5,"118a3b35693b134d56ebd780123b7fd6f1497668")
  ;
  return 0x15;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY
         && (rc2 = rc = sqlite3Reprepare(v))==SQLITE_OK ){
    sqlite3_reset(pStmt);
    v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK && ALWAYS(v->isPrepareV2) && ALWAYS(db->pErr) ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}